

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLReader::checkForSwapped(XMLReader *this)

{
  this->fSwapped = false;
  if (XMLPlatformUtils::fgXMLChBigEndian == '\x01') {
    if ((this->fEncoding | UTF_8) != UTF_16L) {
      return;
    }
  }
  else if ((this->fEncoding | UTF_8) != UTF_16B) {
    return;
  }
  this->fSwapped = true;
  return;
}

Assistant:

void XMLReader::checkForSwapped()
{
    // Assume not swapped
    fSwapped = false;

	if (XMLPlatformUtils::fgXMLChBigEndian)
	{
        if ((fEncoding == XMLRecognizer::UTF_16L)
        ||  (fEncoding == XMLRecognizer::UCS_4L))
        {
            fSwapped = true;
        }
    }
    else
    {
        if ((fEncoding == XMLRecognizer::UTF_16B)
        ||  (fEncoding == XMLRecognizer::UCS_4B))
        {
            fSwapped = true;
        }
    }
}